

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_decompress.c
# Opt level: O2

int flush_uncompressed(FILE *output_file_ptr)

{
  size_t sVar1;
  ulong uVar2;
  
  sVar1 = fwrite(output_buffer,1,(ulong)output_byte_idx,(FILE *)output_file_ptr);
  uVar2 = (ulong)output_byte_idx;
  if (sVar1 != uVar2) {
    log_error("flush_uncompressed","bytes_written (%zu) != out_byte_idx (%u)\n",sVar1);
  }
  else {
    output_byte_idx = 0;
  }
  return (uint)(sVar1 != uVar2);
}

Assistant:

int flush_uncompressed(FILE *output_file_ptr) {
#ifdef _DEBUG
    log_debug("flush_uncompressed", "in_bit_idx=%-8u output_byte_idx=%d\n", in_bit_idx, output_byte_idx);
#endif

    size_t bytes_written = fwrite(output_buffer, sizeof(byte_t), output_byte_idx, output_file_ptr);
    if(bytes_written != output_byte_idx) {
        log_error("flush_uncompressed", "bytes_written (%zu) != out_byte_idx (%u)\n", bytes_written, output_byte_idx);
        return RC_FAIL;
    }

    output_byte_idx = 0;
    return RC_OK;
}